

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation.c
# Opt level: O1

void translation_processLine
               (translation_module_t *translation_modules,FILE *out,csafestring_t *output,char *line
               )

{
  byte bVar1;
  void *method;
  byte *line_00;
  
  if (line == (char *)0x0) {
    if (*output->data != '\0') {
      fprintf((FILE *)out,"__internal_hfunction->safe_strcat(__internal_string, \"%s\");\n");
      safe_emptyBuffer(output);
      return;
    }
  }
  else {
LAB_0010413b:
    while( true ) {
      line_00 = (byte *)line;
      bVar1 = *line_00;
      if (0x1f < bVar1) {
        if (bVar1 == 0x20) goto LAB_0010418b;
        if (bVar1 != 0x22) goto LAB_001041be;
        goto LAB_0010417b;
      }
      if (bVar1 == 9) goto LAB_0010418b;
      if (bVar1 != 10) break;
      line = (char *)(line_00 + 1);
      if (line_00[1] == 0) {
        safe_strchrappend(output,'\0');
      }
    }
    if (bVar1 != 0) goto LAB_001041be;
  }
  return;
LAB_0010418b:
  line = (char *)(line_00 + 1);
  if ((line_00[1] != 9) && (line_00[1] != 0x20)) {
    if (bVar1 == 0x22) {
LAB_0010417b:
      safe_strcat(output,"\\\"");
    }
    else {
      if (bVar1 == 9) {
        safe_strchrappend(output,' ');
        goto LAB_0010413b;
      }
LAB_001041be:
      method = modules_matches(translation_modules,(char *)line_00);
      if (method != (void *)0x0) {
        if (*output->data != '\0') {
          fprintf((FILE *)out,"__internal_hfunction->safe_strcat(__internal_string, \"%s\");\n");
          safe_emptyBuffer(output);
        }
        line = modules_execute(out,method,(char *)line_00);
        goto LAB_0010413b;
      }
      safe_strchrappend(output,*line_00);
    }
    line = (char *)(line_00 + 1);
  }
  goto LAB_0010413b;
}

Assistant:

static void translation_processLine(translation_module_t *translation_modules, FILE *out, csafestring_t *output, char *line) {
	void *method;

	if ( line == NULL ) {
		if ( output->data[0] != '\0' ) {
			fprintf(out, "__internal_hfunction->safe_strcat(__internal_string, \"%s\");\n", output->data);
			safe_emptyBuffer(output);
		}
		return;
	}
	
	while ( *line != '\0' ) {
		if ( *line == '\n' && *( line + 1 ) == '\0' ) {
			safe_strchrappend(output, '\0');
			line++;
		} else if ( *line == '\n' ) {
			line++;
		} else if ( ( *line == ' ' || *line == '\t' ) && ( *( line + 1 ) == ' ' || *( line + 1 ) == '\t' ) ) {
			line++;
		} else if ( *line == '\t' ) {
			safe_strchrappend(output, ' ');
			line++;
		} else if ( *line == '\"' ) {
			safe_strcat(output, "\\\"");
			line++;
		} else {
			method = modules_matches(translation_modules, line);
			if ( method != NULL ) {
				if ( output->data[0] != '\0' ) {
					fprintf(out, "__internal_hfunction->safe_strcat(__internal_string, \"%s\");\n", output->data);
					safe_emptyBuffer(output);
				}
				line = modules_execute(out, method, line);
			} else {
				safe_strchrappend(output, *line);
				line++;
			}
		}
	}
}